

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O3

bool __thiscall
OpenMD::SelectionEvaluator::loadScript(SelectionEvaluator *this,string *filename,string *script)

{
  pointer piVar1;
  pointer piVar2;
  bool bVar3;
  pointer pvVar4;
  pointer pTVar5;
  undefined1 local_58 [32];
  vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
  local_38;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::clear(&(this->variables)._M_t);
  std::__cxx11::string::_M_assign((string *)&this->filename);
  std::__cxx11::string::_M_assign((string *)&this->script);
  bVar3 = SelectionCompiler::compile(&this->compiler,filename,script);
  if (bVar3) {
    this->pc = 0;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::vector(&local_38,&(this->compiler).aatokenCompiled);
    local_58._16_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_58._0_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_58._8_8_ =
         (this->aatoken).
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->aatoken).
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_38.
         super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector((vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
               *)local_58);
    std::
    vector<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
    ::~vector(&local_38);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_58,&(this->compiler).lineNumbers);
    piVar1 = (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
    (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    (this->linenumbers).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_58._16_8_;
    local_58._16_8_ = (pointer)0x0;
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)piVar2 - (long)piVar1);
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
      }
    }
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_58,&(this->compiler).lineIndices);
    piVar1 = (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar2 = (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_58._0_8_;
    (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)local_58._8_8_;
    (this->lineIndices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)local_58._16_8_;
    local_58._0_8_ = (pointer)0x0;
    local_58._8_8_ = (pointer)0x0;
    local_58._16_8_ = (pointer)0x0;
    if (piVar1 != (pointer)0x0) {
      operator_delete(piVar1,(long)piVar2 - (long)piVar1);
      if ((pointer)local_58._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_58._0_8_,local_58._16_8_ - local_58._0_8_);
      }
    }
    this->isDynamic_ = false;
    for (pvVar4 = (this->aatoken).
                  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 != (this->aatoken).
                  super__Vector_base<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>,_std::allocator<std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar4 = pvVar4 + 1) {
      for (pTVar5 = (pvVar4->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pTVar5 != (pvVar4->super__Vector_base<OpenMD::Token,_std::allocator<OpenMD::Token>_>).
                    _M_impl.super__Vector_impl_data._M_finish; pTVar5 = pTVar5 + 1) {
        if ((pTVar5->tok & 0x1000) != 0) {
          this->isDynamic_ = true;
          goto LAB_0025ff5b;
        }
      }
    }
LAB_0025ff5b:
    this->isLoaded_ = true;
  }
  else {
    this->error = true;
    SelectionCompiler::getErrorMessage_abi_cxx11_((string *)local_58,&this->compiler);
    std::__cxx11::string::operator=((string *)&this->errorMessage,(string *)local_58);
    if ((pointer)local_58._0_8_ != (pointer)(local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,(ulong)(local_58._16_8_ + 1));
    }
    snprintf(painCave.errMsg,2000,"SelectionCompiler Error: %s\n",
             (this->errorMessage)._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
  }
  return bVar3;
}

Assistant:

bool SelectionEvaluator::loadScript(const std::string& filename,
                                      const std::string& script) {
    clearDefinitionsAndLoadPredefined();
    this->filename = filename;
    this->script   = script;
    if (!compiler.compile(filename, script)) {
      error        = true;
      errorMessage = compiler.getErrorMessage();

      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "SelectionCompiler Error: %s\n", errorMessage.c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
      return false;
    }

    pc          = 0;
    aatoken     = compiler.getAatokenCompiled();
    linenumbers = compiler.getLineNumbers();
    lineIndices = compiler.getLineIndices();

    std::vector<std::vector<Token>>::const_iterator i;

    isDynamic_ = false;
    for (i = aatoken.begin(); i != aatoken.end(); ++i) {
      if (containDynamicToken(*i)) {
        isDynamic_ = true;
        break;
      }
    }

    isLoaded_ = true;
    return true;
  }